

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O1

void __thiscall
hrgls::API::API(API *this,string *user,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *credentials)

{
  int iVar1;
  pointer puVar2;
  mapped_type mVar3;
  API_private *pAVar4;
  pthread_t pVar5;
  mapped_type *pmVar6;
  _Rb_tree_header *p_Var7;
  hrgls_APICreateParams params;
  key_type local_48;
  undefined8 local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  
  this->m_private = (API_private *)0x0;
  local_38 = credentials;
  pAVar4 = (API_private *)operator_new(0x70);
  p_Var7 = &(pAVar4->m_status)._M_t._M_impl.super__Rb_tree_header;
  (pAVar4->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (pAVar4->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (pAVar4->m_cppMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pAVar4->m_cppMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(pAVar4->m_cppMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(pAVar4->m_cppMutex).super___mutex_base._M_mutex + 0x10) = 0;
  pAVar4->m_cppUserData = (void *)0x0;
  (pAVar4->m_cppMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)&(pAVar4->m_status)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (pAVar4->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pAVar4->m_api = (hrgls_API)0x0;
  *(undefined8 *)&(pAVar4->m_status)._M_t._M_impl = 0;
  (pAVar4->m_status)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pAVar4->m_cppHandler = (LogMessageCallback)0x0;
  (pAVar4->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var7->_M_header;
  (pAVar4->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var7->_M_header;
  this->m_private = pAVar4;
  mVar3 = hrgls_APICreateParametersCreate(&local_40);
  pAVar4 = this->m_private;
  pVar5 = pthread_self();
  local_48._M_thread = pVar5;
  pmVar6 = std::
           map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
           ::operator[](&pAVar4->m_status,&local_48);
  *pmVar6 = mVar3;
  local_48._M_thread = pVar5;
  pmVar6 = std::
           map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
           ::operator[](&this->m_private->m_status,&local_48);
  if (*pmVar6 == 0) {
    mVar3 = hrgls_APICreateParametersSetName(local_40,(user->_M_dataplus)._M_p);
    local_48._M_thread = pVar5;
    pmVar6 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&this->m_private->m_status,&local_48);
    *pmVar6 = mVar3;
    local_48._M_thread = pVar5;
    pmVar6 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&this->m_private->m_status,&local_48);
    if (*pmVar6 == 0) {
      puVar2 = (local_38->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start;
      mVar3 = hrgls_APICreateParametersSetCredentials
                        (local_40,puVar2,
                         *(int *)&(local_38->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish - (int)puVar2);
      local_48._M_thread = pVar5;
      pmVar6 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[](&this->m_private->m_status,&local_48);
      *pmVar6 = mVar3;
      local_48._M_thread = pVar5;
      pmVar6 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[](&this->m_private->m_status,&local_48);
      if (*pmVar6 == 0) {
        mVar3 = hrgls_APICreate(this->m_private,local_40);
        local_48._M_thread = pVar5;
        pmVar6 = std::
                 map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                 ::operator[](&this->m_private->m_status,&local_48);
        *pmVar6 = mVar3;
        local_48._M_thread = pVar5;
        pmVar6 = std::
                 map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                 ::operator[](&this->m_private->m_status,&local_48);
        iVar1 = *pmVar6;
        mVar3 = hrgls_APICreateParametersDestroy(local_40);
        if (iVar1 == 0) {
          local_48._M_thread = pVar5;
          pmVar6 = std::
                   map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                   ::operator[](&this->m_private->m_status,&local_48);
          *pmVar6 = mVar3;
        }
        else {
          this->m_private->m_api = (hrgls_API)0x0;
        }
      }
    }
  }
  return;
}

Assistant:

API::API(
    ::std::string user,
    ::std::vector<uint8_t> credentials)
  {
    // Create the private api pointer we're going to use.  Check for
    // exception when creating it, to avoid passing it up to the caller.
    try {
      m_private = new API_private();
    } catch (...) {
      m_private = nullptr;
      return;
    }

    // Create and fill in the parameters to the API creation routine
    hrgls_APICreateParams params;
    m_private->m_status[std::this_thread::get_id()] = hrgls_APICreateParametersCreate(&params);
    if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
      return;
    }
    m_private->m_status[std::this_thread::get_id()] = hrgls_APICreateParametersSetName(params, user.c_str());
    if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
      return;
    }
    m_private->m_status[std::this_thread::get_id()] = hrgls_APICreateParametersSetCredentials(params,
      credentials.data(), static_cast<uint32_t>(credentials.size()));
    if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
      return;
    }

    // Create the API object we're going to use.
    m_private->m_status[std::this_thread::get_id()] = hrgls_APICreate(&m_private->m_api, params);
    if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
      hrgls_APICreateParametersDestroy(params);
      m_private->m_api = nullptr;
      return;
    }

    // Destroy the parameter object we created above.
    m_private->m_status[std::this_thread::get_id()] = hrgls_APICreateParametersDestroy(params);
  }